

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O1

int Psr_ManReadInstance(Psr_Man_t *p,int Func)

{
  byte bVar1;
  char cVar2;
  int InstName;
  int iVar3;
  int Entry;
  char *pcVar4;
  byte *pbVar5;
  int Value;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  byte *pbVar9;
  char *pcVar10;
  long lVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  
  pbVar9 = (byte *)p->pLimit;
  pbVar5 = (byte *)p->pCur;
  if (pbVar5 < pbVar9) {
LAB_0039af67:
    uVar8 = (ulong)*pbVar5;
    if (uVar8 < 0x30) {
      if ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        goto LAB_0039af67;
      }
      if (uVar8 != 0x2f) {
        if (uVar8 != 0) goto LAB_0039b058;
        goto LAB_0039b009;
      }
      if (pbVar5[1] != 0x2a) {
        if (pbVar5[1] == 0x2f) {
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar5 < pbVar9) {
            while (*pbVar5 != 10) {
              pbVar5 = pbVar5 + 1;
              p->pCur = (char *)pbVar5;
              if (pbVar5 == pbVar9) goto LAB_0039b058;
            }
            pbVar5 = pbVar5 + 1;
            goto LAB_0039aff5;
          }
        }
        goto LAB_0039b058;
      }
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar9 <= pbVar5) goto LAB_0039b058;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar9) goto LAB_0039b058;
      }
      pbVar5 = pbVar5 + 2;
LAB_0039aff5:
      p->pCur = (char *)pbVar5;
      if (pbVar9 <= pbVar5) goto LAB_0039b009;
      goto LAB_0039af67;
    }
LAB_0039b058:
    pbVar9 = (byte *)p->pCur;
    bVar1 = *pbVar9;
    if (bVar1 == 0x5c) {
      pbVar9 = pbVar9 + 1;
      pbVar5 = pbVar9;
      do {
        p->pCur = (char *)pbVar5;
        bVar1 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar1 != 0x20);
    }
    else {
      if ((bVar1 != 0x5f) && (InstName = 0, (byte)((bVar1 & 0xdf) + 0xa5) < 0xe6))
      goto LAB_0039b0c2;
      pbVar5 = pbVar9 + 1;
      do {
        do {
          p->pCur = (char *)pbVar5;
          bVar1 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        } while (0xf5 < (byte)(bVar1 - 0x3a));
      } while (((bVar1 == 0x24) || (bVar1 == 0x5f)) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)));
    }
    InstName = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar9,p->pCur,(int *)0x0);
LAB_0039b0c2:
    if (InstName != 0) {
      pbVar9 = (byte *)p->pLimit;
      pbVar5 = (byte *)p->pCur;
      do {
        if (pbVar9 <= pbVar5) {
LAB_0039b174:
          if (p->ErrorStr[0] == '\0') {
            builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
            if (p->ErrorStr[0] != '\0') goto LAB_0039ba0a;
            uVar15._0_1_ = ' ';
            uVar15._1_1_ = '2';
            uVar15._2_1_ = '6';
            uVar15._3_1_ = '.';
            goto LAB_0039b30a;
          }
          goto LAB_0039ba0a;
        }
        while( true ) {
          uVar8 = (ulong)*pbVar5;
          if (0x2f < uVar8) goto LAB_0039b1c3;
          if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
        }
        if (uVar8 != 0x2f) {
          if (uVar8 == 0) goto LAB_0039b174;
          break;
        }
        if (pbVar5[1] != 0x2a) {
          if (pbVar5[1] == 0x2f) {
            pbVar5 = pbVar5 + 2;
            p->pCur = (char *)pbVar5;
            if (pbVar5 < pbVar9) {
              while (*pbVar5 != 10) {
                pbVar5 = pbVar5 + 1;
                p->pCur = (char *)pbVar5;
                if (pbVar5 == pbVar9) goto LAB_0039b1c3;
              }
              pbVar5 = pbVar5 + 1;
              goto LAB_0039b166;
            }
          }
          break;
        }
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar9 <= pbVar5) break;
        while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar9) goto LAB_0039b1c3;
        }
        pbVar5 = pbVar5 + 2;
LAB_0039b166:
        p->pCur = (char *)pbVar5;
      } while( true );
    }
LAB_0039b1c3:
    if (*p->pCur != '(') {
      if (p->ErrorStr[0] == '\0') {
        builtin_strncpy(p->ErrorStr,"Expecting \"(\" in module instantiation.",0x27);
        return 0;
      }
      goto LAB_0039ba0a;
    }
    pbVar5 = (byte *)(p->pCur + 1);
    p->pCur = (char *)pbVar5;
    pbVar9 = (byte *)p->pLimit;
    do {
      if (pbVar9 <= pbVar5) {
LAB_0039b2c0:
        if (p->ErrorStr[0] == '\0') {
          builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
          if (p->ErrorStr[0] != '\0') goto LAB_0039ba0a;
          uVar15._0_1_ = ' ';
          uVar15._1_1_ = '2';
          uVar15._2_1_ = '7';
          uVar15._3_1_ = '.';
          goto LAB_0039b30a;
        }
        goto LAB_0039ba0a;
      }
      while( true ) {
        uVar8 = (ulong)*pbVar5;
        if (0x2f < uVar8) goto LAB_0039b322;
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar8 != 0x2f) {
        if (uVar8 == 0) goto LAB_0039b2c0;
LAB_0039b322:
        pcVar10 = p->pCur;
        if (*pcVar10 != '.') {
          pcVar4 = Abc_NamStr(p->pStrs,Func);
          pcVar10 = "const0";
          lVar11 = 1;
          goto LAB_0039b686;
        }
        (p->vTemp).nSize = 0;
        if (*pcVar10 != '.') {
          __assert_fail("Psr_ManIsChar(p, \'.\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadVer.c"
                        ,0x1d6,"int Psr_ManReadSignalList2(Psr_Man_t *, Vec_Int_t *)");
        }
        goto LAB_0039b348;
      }
      bVar1 = pbVar5[1];
      uVar8 = (ulong)bVar1;
      if (bVar1 != 0x2a) {
        if (bVar1 == 0x2f) {
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar5 < pbVar9) {
            while (*pbVar5 != 10) {
              pbVar5 = pbVar5 + 1;
              p->pCur = (char *)pbVar5;
              if (pbVar5 == pbVar9) goto LAB_0039b322;
            }
            pbVar5 = pbVar5 + 1;
            goto LAB_0039b279;
          }
        }
        goto LAB_0039b322;
      }
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar9 <= pbVar5) goto LAB_0039b322;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar9) goto LAB_0039b322;
      }
      pbVar5 = pbVar5 + 2;
LAB_0039b279:
      p->pCur = (char *)pbVar5;
    } while( true );
  }
LAB_0039b009:
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] == '\0') {
      uVar15._0_1_ = ' ';
      uVar15._1_1_ = '2';
      uVar15._2_1_ = '5';
      uVar15._3_1_ = '.';
LAB_0039b30a:
      p->ErrorStr[0] = 'E';
      p->ErrorStr[1] = 'r';
      p->ErrorStr[2] = 'r';
      p->ErrorStr[3] = 'o';
      p->ErrorStr[4] = 'r';
      p->ErrorStr[5] = ' ';
      p->ErrorStr[6] = 'n';
      p->ErrorStr[7] = 'u';
      p->ErrorStr[8] = 'm';
      p->ErrorStr[9] = 'b';
      p->ErrorStr[10] = 'e';
      p->ErrorStr[0xb] = 'r';
      *(undefined4 *)(p->ErrorStr + 0xc) = uVar15;
      p->ErrorStr[0x10] = '\0';
      return 0;
    }
  }
LAB_0039ba0a:
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrs.h"
                ,0x9d,"int Psr_ManErrorSet(Psr_Man_t *, char *, int)");
  while( true ) {
    pcVar10 = s_VerilogModules[lVar11];
    lVar11 = lVar11 + 1;
    if (lVar11 == 0x10) break;
LAB_0039b686:
    iVar3 = strcmp(pcVar4,pcVar10);
    if (iVar3 == 0) {
      Func = (int)lVar11 + 5;
      goto LAB_0039b6a9;
    }
  }
  Func = 0;
LAB_0039b6a9:
  if (Func == 0) {
    Psr_ManErrorSet(p,"Cannot find elementary gate.",Value);
    return 0;
  }
  iVar3 = Psr_ManReadSignalList(p,&p->vTemp,')',1);
  uVar8 = extraout_RDX_02;
  goto LAB_0039b8d2;
LAB_0039b348:
  pcVar4 = pcVar10 + 1;
  p->pCur = pcVar4;
  bVar1 = pcVar10[1];
  if (bVar1 == 0x5c) {
    pcVar4 = pcVar10 + 2;
    pcVar10 = pcVar4;
    do {
      p->pCur = pcVar10;
      cVar2 = *pcVar10;
      pcVar10 = pcVar10 + 1;
    } while (cVar2 != ' ');
LAB_0039b3ae:
    iVar3 = Abc_NamStrFindOrAddLim(p->pStrs,pcVar4,p->pCur,(int *)0x0);
    uVar8 = extraout_RDX;
  }
  else if ((bVar1 == 0x5f) || (iVar3 = 0, 0xe5 < (byte)((bVar1 & 0xdf) + 0xa5))) {
    pbVar9 = (byte *)(pcVar10 + 2);
    do {
      do {
        p->pCur = (char *)pbVar9;
        bVar1 = *pbVar9;
        pbVar9 = pbVar9 + 1;
      } while (0xf5 < (byte)(bVar1 - 0x3a));
    } while (((bVar1 == 0x24) || (bVar1 == 0x5f)) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)));
    goto LAB_0039b3ae;
  }
  if (iVar3 == 0) {
    if (p->ErrorStr[0] != '\0') goto LAB_0039ba0a;
    builtin_strncpy(p->ErrorStr + 0x10,"al name of the instance.",0x19);
    uVar17._0_1_ = 'f';
    uVar17._1_1_ = 'o';
    uVar17._2_1_ = 'r';
    uVar17._3_1_ = 'm';
LAB_0039b871:
    p->ErrorStr[0] = 'C';
    p->ErrorStr[1] = 'a';
    p->ErrorStr[2] = 'n';
    p->ErrorStr[3] = 'n';
    p->ErrorStr[4] = 'o';
    p->ErrorStr[5] = 't';
    p->ErrorStr[6] = ' ';
    p->ErrorStr[7] = 'r';
    p->ErrorStr[8] = 'e';
    p->ErrorStr[9] = 'a';
    p->ErrorStr[10] = 'd';
    p->ErrorStr[0xb] = ' ';
    *(undefined4 *)(p->ErrorStr + 0xc) = uVar17;
LAB_0039b8cb:
    iVar3 = 0;
    goto LAB_0039b8d2;
  }
  if (*p->pCur != '(') {
    if (p->ErrorStr[0] != '\0') goto LAB_0039ba0a;
    builtin_strncpy(p->ErrorStr + 0x10,"in the instance.",0x10);
    uVar12._0_1_ = 'C';
    uVar12._1_1_ = 'a';
    uVar12._2_1_ = 'n';
    uVar12._3_1_ = 'n';
    uVar13._0_1_ = 'o';
    uVar13._1_1_ = 't';
    uVar13._2_1_ = ' ';
    uVar13._3_1_ = 'r';
    uVar14._0_1_ = 'e';
    uVar14._1_1_ = 'a';
    uVar14._2_1_ = 'd';
    uVar14._3_1_ = ' ';
    uVar18._0_1_ = '\"';
    uVar18._1_1_ = '(';
    uVar18._2_1_ = '\"';
    uVar18._3_1_ = ' ';
    goto LAB_0039b8c4;
  }
  pbVar5 = (byte *)(p->pCur + 1);
  p->pCur = (char *)pbVar5;
  pbVar9 = (byte *)p->pLimit;
LAB_0039b3e1:
  if (pbVar9 <= pbVar5) {
LAB_0039b6ee:
    if (p->ErrorStr[0] != '\0') goto LAB_0039ba0a;
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] != '\0') goto LAB_0039ba0a;
    uVar16._0_1_ = ' ';
    uVar16._1_1_ = '1';
    uVar16._2_1_ = '7';
    uVar16._3_1_ = '.';
    goto LAB_0039b78e;
  }
  while( true ) {
    uVar8 = (ulong)*pbVar5;
    if (0x2f < uVar8) goto LAB_0039b47b;
    if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
  }
  if (uVar8 == 0x2f) {
    bVar1 = pbVar5[1];
    uVar8 = (ulong)bVar1;
    if (bVar1 == 0x2a) {
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar9 <= pbVar5) goto LAB_0039b47b;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar9) goto LAB_0039b47b;
      }
      pbVar5 = pbVar5 + 2;
    }
    else {
      if (bVar1 != 0x2f) goto LAB_0039b47b;
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar9 <= pbVar5) goto LAB_0039b47b;
      while (*pbVar5 != 10) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar9) goto LAB_0039b47b;
      }
      pbVar5 = pbVar5 + 1;
    }
    p->pCur = (char *)pbVar5;
    goto LAB_0039b3e1;
  }
  if (uVar8 == 0) goto LAB_0039b6ee;
LAB_0039b47b:
  Entry = Psr_ManReadSignal(p);
  uVar8 = extraout_RDX_00;
  if (Entry == 0) {
    if (p->ErrorStr[0] != '\0') goto LAB_0039ba0a;
    builtin_strncpy(p->ErrorStr + 0x10,"al name of the instance.",0x19);
    uVar17._0_1_ = 'a';
    uVar17._1_1_ = 'c';
    uVar17._2_1_ = 't';
    uVar17._3_1_ = 'u';
    goto LAB_0039b871;
  }
  if (*p->pCur != ')') {
    if (p->ErrorStr[0] != '\0') goto LAB_0039ba0a;
    builtin_strncpy(p->ErrorStr + 0x10,"in the instance.",0x10);
    uVar12._0_1_ = 'C';
    uVar12._1_1_ = 'a';
    uVar12._2_1_ = 'n';
    uVar12._3_1_ = 'n';
    uVar13._0_1_ = 'o';
    uVar13._1_1_ = 't';
    uVar13._2_1_ = ' ';
    uVar13._3_1_ = 'r';
    uVar14._0_1_ = 'e';
    uVar14._1_1_ = 'a';
    uVar14._2_1_ = 'd';
    uVar14._3_1_ = ' ';
    uVar18._0_1_ = '\"';
    uVar18._1_1_ = ')';
    uVar18._2_1_ = '\"';
    uVar18._3_1_ = ' ';
LAB_0039b8c4:
    *(undefined4 *)p->ErrorStr = uVar12;
    *(undefined4 *)(p->ErrorStr + 4) = uVar13;
    *(undefined4 *)(p->ErrorStr + 8) = uVar14;
    *(undefined4 *)(p->ErrorStr + 0xc) = uVar18;
    p->ErrorStr[0x20] = '\0';
    goto LAB_0039b8cb;
  }
  p->pCur = p->pCur + 1;
  Vec_IntPush(&p->vTemp,iVar3);
  Vec_IntPush(&p->vTemp,Entry);
  pbVar9 = (byte *)p->pLimit;
  pbVar5 = (byte *)p->pCur;
  uVar8 = extraout_RDX_01;
LAB_0039b4c0:
  if (pbVar9 <= pbVar5) {
LAB_0039b73f:
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
      if (p->ErrorStr[0] == '\0') {
        uVar16._0_1_ = ' ';
        uVar16._1_1_ = '1';
        uVar16._2_1_ = '8';
        uVar16._3_1_ = '.';
LAB_0039b78e:
        p->ErrorStr[0] = 'E';
        p->ErrorStr[1] = 'r';
        p->ErrorStr[2] = 'r';
        p->ErrorStr[3] = 'o';
        p->ErrorStr[4] = 'r';
        p->ErrorStr[5] = ' ';
        p->ErrorStr[6] = 'n';
        p->ErrorStr[7] = 'u';
        p->ErrorStr[8] = 'm';
        p->ErrorStr[9] = 'b';
        p->ErrorStr[10] = 'e';
        p->ErrorStr[0xb] = 'r';
        *(undefined4 *)(p->ErrorStr + 0xc) = uVar16;
        p->ErrorStr[0x10] = '\0';
        iVar3 = 0;
        goto LAB_0039b8d2;
      }
    }
    goto LAB_0039ba0a;
  }
  while( true ) {
    uVar8 = (ulong)*pbVar5;
    if (0x2f < uVar8) goto LAB_0039b55a;
    if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
  }
  if (uVar8 == 0x2f) {
    bVar1 = pbVar5[1];
    uVar8 = (ulong)bVar1;
    if (bVar1 != 0x2a) {
      if (bVar1 == 0x2f) {
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar5 < pbVar9) {
          while (*pbVar5 != 10) {
            pbVar5 = pbVar5 + 1;
            p->pCur = (char *)pbVar5;
            if (pbVar5 == pbVar9) goto LAB_0039b55a;
          }
          pbVar5 = pbVar5 + 1;
          goto LAB_0039b548;
        }
      }
      goto LAB_0039b55a;
    }
    pbVar5 = pbVar5 + 2;
    p->pCur = (char *)pbVar5;
    if (pbVar9 <= pbVar5) goto LAB_0039b55a;
    while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
      if (pbVar5 == pbVar9) goto LAB_0039b55a;
    }
    pbVar5 = pbVar5 + 2;
LAB_0039b548:
    p->pCur = (char *)pbVar5;
    goto LAB_0039b4c0;
  }
  if (uVar8 == 0) goto LAB_0039b73f;
LAB_0039b55a:
  pbVar5 = (byte *)p->pCur;
  bVar1 = *pbVar5;
  uVar8 = (ulong)bVar1;
  if (bVar1 == 0x2c) {
LAB_0039b56a:
    pbVar5 = pbVar5 + 1;
    do {
      p->pCur = (char *)pbVar5;
      if (pbVar9 <= pbVar5) {
LAB_0039b607:
        if (p->ErrorStr[0] != '\0') goto LAB_0039ba0a;
        builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
        if (p->ErrorStr[0] != '\0') goto LAB_0039ba0a;
        uVar16._0_1_ = ' ';
        uVar16._1_1_ = '1';
        uVar16._2_1_ = '9';
        uVar16._3_1_ = '.';
        goto LAB_0039b78e;
      }
      while( true ) {
        uVar8 = (ulong)*pbVar5;
        if (0x2f < uVar8) goto LAB_0039b5f0;
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar8 != 0x2f) {
        if (uVar8 == 0) goto LAB_0039b607;
        goto LAB_0039b5f0;
      }
      bVar1 = pbVar5[1];
      uVar8 = (ulong)bVar1;
      if (bVar1 != 0x2a) goto LAB_0039b5cd;
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar9 <= pbVar5) goto LAB_0039b5f0;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar9) goto LAB_0039b5f0;
      }
      pbVar5 = pbVar5 + 2;
    } while( true );
  }
  if (bVar1 != 0x29) {
    if (p->ErrorStr[0] != '\0') goto LAB_0039ba0a;
    builtin_strncpy(p->ErrorStr + 0x10,"in the instance.",0x10);
    uVar12._0_1_ = 'E';
    uVar12._1_1_ = 'x';
    uVar12._2_1_ = 'p';
    uVar12._3_1_ = 'e';
    uVar13._0_1_ = 'c';
    uVar13._1_1_ = 't';
    uVar13._2_1_ = 'i';
    uVar13._3_1_ = 'n';
    uVar14._0_1_ = 'g';
    uVar14._1_1_ = ' ';
    uVar14._2_1_ = 'c';
    uVar14._3_1_ = 'o';
    uVar18._0_1_ = 'm';
    uVar18._1_1_ = 'm';
    uVar18._2_1_ = 'a';
    uVar18._3_1_ = ' ';
    goto LAB_0039b8c4;
  }
  goto LAB_0039b7a5;
LAB_0039b5cd:
  if (bVar1 != 0x2f) goto LAB_0039b5f0;
  pbVar5 = pbVar5 + 2;
  p->pCur = (char *)pbVar5;
  if (pbVar9 <= pbVar5) goto LAB_0039b5f0;
  while (*pbVar5 != 10) {
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
    if (pbVar5 == pbVar9) goto LAB_0039b5f0;
  }
  goto LAB_0039b56a;
LAB_0039b5f0:
  pcVar10 = p->pCur;
  if (*pcVar10 != '.') goto LAB_0039b7a5;
  goto LAB_0039b348;
LAB_0039b7a5:
  uVar6 = (p->vTemp).nSize;
  if ((int)uVar6 < 1) {
    __assert_fail("Vec_IntSize(vTemp) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadVer.c"
                  ,0x1ea,"int Psr_ManReadSignalList2(Psr_Man_t *, Vec_Int_t *)");
  }
  iVar3 = 1;
  if ((uVar6 & 1) != 0) {
    __assert_fail("Vec_IntSize(vTemp) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadVer.c"
                  ,0x1eb,"int Psr_ManReadSignalList2(Psr_Man_t *, Vec_Int_t *)");
  }
LAB_0039b8d2:
  uVar6 = (uint)uVar8;
  if (iVar3 == 0) {
    pcVar10 = "Error number 28.";
  }
  else {
    if (*p->pCur != ')') {
      __assert_fail("Psr_ManIsChar(p, \')\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadVer.c"
                    ,0x286,"int Psr_ManReadInstance(Psr_Man_t *, int)");
    }
    pbVar5 = (byte *)(p->pCur + 1);
    p->pCur = (char *)pbVar5;
    pbVar9 = (byte *)p->pLimit;
    while (uVar6 = (uint)uVar8, pbVar5 < pbVar9) {
      while( true ) {
        bVar1 = *pbVar5;
        uVar8 = (ulong)bVar1;
        uVar6 = (uint)bVar1;
        uVar7 = (uint)bVar1;
        if (0x2f < uVar8) goto LAB_0039b9cd;
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar8 != 0x2f) {
        if (uVar8 != 0) {
LAB_0039b9cd:
          uVar6 = uVar7;
          if (*p->pCur == ';') {
            Psr_NtkAddBox(p->pNtk,Func,InstName,&p->vTemp);
            return 1;
          }
          pcVar10 = "Expecting semicolon in the instance.";
          goto LAB_0039b9fd;
        }
        break;
      }
      bVar1 = pbVar5[1];
      uVar8 = (ulong)bVar1;
      uVar7 = (uint)bVar1;
      if (bVar1 != 0x2a) {
        if (bVar1 == 0x2f) {
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar5 < pbVar9) {
            while (*pbVar5 != 10) {
              pbVar5 = pbVar5 + 1;
              p->pCur = (char *)pbVar5;
              if (pbVar5 == pbVar9) goto LAB_0039b9cd;
            }
            pbVar5 = pbVar5 + 1;
            goto LAB_0039b982;
          }
        }
        goto LAB_0039b9cd;
      }
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar9 <= pbVar5) goto LAB_0039b9cd;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar9) goto LAB_0039b9cd;
      }
      pbVar5 = pbVar5 + 2;
LAB_0039b982:
      p->pCur = (char *)pbVar5;
    }
    if (p->ErrorStr[0] != '\0') goto LAB_0039ba0a;
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    pcVar10 = "Error number 29.";
  }
LAB_0039b9fd:
  Psr_ManErrorSet(p,pcVar10,uVar6);
  return 0;
}

Assistant:

static inline int Psr_ManReadInstance( Psr_Man_t * p, int Func )
{
    int InstId, Status;
/*
    static Counter = 0;
    if ( ++Counter == 7 )
    {
        int s=0;
    }
*/
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 25.", 0);
    if ( (InstId = Psr_ManReadName(p)) )
        if (Psr_ManUtilSkipSpaces(p))       return Psr_ManErrorSet(p, "Error number 26.", 0);
    if ( !Psr_ManIsChar(p, '(') )           return Psr_ManErrorSet(p, "Expecting \"(\" in module instantiation.", 0);
    p->pCur++;
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 27.", 0);
    if ( Psr_ManIsChar(p, '.') ) // box
        Status = Psr_ManReadSignalList2(p, &p->vTemp);
    else  // node
    {
        //char * s = Abc_NamStr(p->pStrs, Func);
        // translate elementary gate
        int iFuncNew = Psr_ManIsVerilogModule(p, Abc_NamStr(p->pStrs, Func));
        if ( iFuncNew == 0 )                return Psr_ManErrorSet(p, "Cannot find elementary gate.", 0);
        Func = iFuncNew;
        Status = Psr_ManReadSignalList( p, &p->vTemp, ')', 1 );
    }
    if ( Status == 0 )                      return Psr_ManErrorSet(p, "Error number 28.", 0);
    assert( Psr_ManIsChar(p, ')') );
    p->pCur++;
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 29.", 0);
    if ( !Psr_ManIsChar(p, ';') )           return Psr_ManErrorSet(p, "Expecting semicolon in the instance.", 0);
    // add box 
    Psr_NtkAddBox( p->pNtk, Func, InstId, &p->vTemp );
    return 1;
}